

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O3

shared_ptr<const_Assimp::FIValue> __thiscall
Assimp::FIShortDecoder::decode(FIShortDecoder *this,uint8_t *data,size_t len)

{
  ushort uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  FIShortDecoder FVar2;
  DeadlyImportError *this_00;
  ulong in_RCX;
  ulong uVar3;
  shared_ptr<const_Assimp::FIValue> sVar4;
  int16_t v;
  ushort local_4a;
  vector<short,_std::allocator<short>_> local_48;
  
  if ((in_RCX & 1) == 0) {
    local_48.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_48.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
    _M_finish = (short *)0x0;
    local_48.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<short,_std::allocator<short>_>::reserve(&local_48,in_RCX >> 1);
    if (in_RCX != 0) {
      uVar3 = 0;
      do {
        uVar1 = *(ushort *)(len + uVar3 * 2);
        local_4a = uVar1 << 8 | uVar1 >> 8;
        if (local_48.super__Vector_base<short,_std::allocator<short>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_48.super__Vector_base<short,_std::allocator<short>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<short,std::allocator<short>>::_M_realloc_insert<short_const&>
                    ((vector<short,std::allocator<short>> *)&local_48,
                     (iterator)
                     local_48.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                     super__Vector_impl_data._M_finish,(short *)&local_4a);
        }
        else {
          *local_48.super__Vector_base<short,_std::allocator<short>_>._M_impl.
           super__Vector_impl_data._M_finish = local_4a;
          local_48.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data
          ._M_finish = local_48.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1;
        }
        uVar3 = uVar3 + 1;
      } while (in_RCX >> 1 != uVar3);
    }
    FVar2 = (FIShortDecoder)operator_new(0x58);
    *(undefined8 *)((long)FVar2 + 8) = 0x100000001;
    *(undefined ***)FVar2 = &PTR___Sp_counted_ptr_inplace_009a7998;
    *(undefined ***)((long)FVar2 + 0x10) = &PTR_toString_abi_cxx11__009a79e8;
    *(undefined8 **)((long)FVar2 + 0x30) = (undefined8 *)((long)FVar2 + 0x40);
    *(undefined8 *)((long)FVar2 + 0x38) = 0;
    *(undefined1 *)((long)FVar2 + 0x40) = 0;
    *(undefined1 *)((long)FVar2 + 0x50) = 0;
    *(pointer *)((long)FVar2 + 0x18) =
         local_48.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
         _M_start;
    *(pointer *)((long)FVar2 + 0x20) =
         local_48.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    *(pointer *)((long)FVar2 + 0x28) =
         local_48.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    *this = (FIShortDecoder)((long)FVar2 + 0x10);
    this[1] = FVar2;
    sVar4.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         local_48.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    sVar4.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<const_Assimp::FIValue>)
           sVar4.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  DeadlyImportError::DeadlyImportError(this_00,(string *)&parseErrorMessage_abi_cxx11_);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

virtual std::shared_ptr<const FIValue> decode(const uint8_t *data, size_t len) /*override*/ {
        if (len & 1) {
            throw DeadlyImportError(parseErrorMessage);
        }
        std::vector<int16_t> value;
        size_t numShorts = len / 2;
        value.reserve(numShorts);
        for (size_t i = 0; i < numShorts; ++i) {
            int16_t v = (data[0] << 8) | data[1];
            value.push_back(v);
            data += 2;
        }
        return FIShortValue::create(std::move(value));
    }